

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int luv_fs_write(lua_State *L)

{
  int *piVar1;
  int iVar2;
  lua_Integer lVar3;
  luv_req_t *plVar4;
  uv_loop_t *loop;
  uv_fs_cb cb;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  uv_buf_t *local_88;
  int nargs;
  luv_req_t *data;
  int sync;
  int ret;
  uv_buf_t *bufs;
  size_t count;
  uv_fs_t *req;
  lua_Integer lStack_38;
  int ref;
  int64_t offset;
  uv_buf_t buf;
  uv_file file;
  lua_State *L_local;
  
  lVar3 = luaL_checkinteger(L,1);
  buf.len._4_4_ = (uv_file)lVar3;
  _sync = (uv_buf_t *)0x0;
  iVar2 = lua_type(L,2);
  if (iVar2 == 5) {
    _sync = luv_prep_bufs(L,2,(size_t *)&bufs);
    offset = 0;
  }
  else {
    iVar2 = lua_isstring(L,2);
    if (iVar2 == 0) {
      iVar2 = luaL_argerror(L,2,"data must be string or table of strings");
      return iVar2;
    }
    luv_check_buf(L,2,(uv_buf_t *)&offset);
    bufs = (uv_buf_t *)0x1;
  }
  lStack_38 = luaL_checkinteger(L,3);
  req._4_4_ = luv_check_continuation(L,4);
  count = (size_t)lua_newuserdata(L,0x1b8);
  plVar4 = luv_setup_req(L,req._4_4_);
  *(luv_req_t **)count = plVar4;
  *(int64_t *)(count + 0x60) = offset;
  *(uv_buf_t **)(*(long *)count + 0x10) = _sync;
  piVar1 = *(int **)count;
  bVar7 = piVar1[1] == -2;
  loop = luv_loop(L);
  if (_sync == (uv_buf_t *)0x0) {
    local_88 = (uv_buf_t *)&offset;
  }
  else {
    local_88 = _sync;
  }
  cb = luv_fs_cb;
  if (bVar7) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_write(loop,(uv_fs_t *)count,buf.len._4_4_,local_88,(uint)bufs,lStack_38,cb);
  if ((*(int *)(count + 0x40) == 0xc) || (-1 < iVar2)) {
    if (bVar7) {
      L_local._4_4_ = push_fs_result(L,(uv_fs_t *)count);
      if (*(int *)(count + 0x40) != 0x16) {
        luv_cleanup_req(L,*(luv_req_t **)count);
        *(undefined8 *)count = 0;
        uv_fs_req_cleanup((uv_fs_t *)count);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)*piVar1);
      L_local._4_4_ = 1;
    }
  }
  else {
    lua_pushnil(L);
    if (*(long *)(count + 0x68) == 0) {
      pcVar5 = uv_err_name((int)*(undefined8 *)(count + 0x58));
      pcVar6 = uv_strerror((int)*(undefined8 *)(count + 0x58));
      lua_pushfstring(L,"%s: %s",pcVar5,pcVar6);
    }
    else {
      pcVar5 = uv_err_name((int)*(undefined8 *)(count + 0x58));
      pcVar6 = uv_strerror((int)*(undefined8 *)(count + 0x58));
      lua_pushfstring(L,"%s: %s: %s",pcVar5,pcVar6,*(undefined8 *)(count + 0x68));
    }
    pcVar5 = uv_err_name((int)*(undefined8 *)(count + 0x58));
    lua_pushstring(L,pcVar5);
    luv_cleanup_req(L,*(luv_req_t **)count);
    *(undefined8 *)count = 0;
    uv_fs_req_cleanup((uv_fs_t *)count);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_write(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  int64_t offset = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  size_t count;
  uv_buf_t* bufs = luv_check_bufs(L, 2, &count, (luv_req_t*)req->data);
  int nargs;
  FS_CALL_NORETURN(write, req, file, bufs, count, offset);
  free(bufs);
  return nargs;
}